

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgunzip.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  uint local_50;
  int local_48;
  int res;
  int retval;
  uint outlen;
  uint dlen;
  uint len;
  uchar *dest;
  uchar *source;
  FILE *fout;
  FILE *fin;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  fout = (FILE *)0x0;
  source = (uchar *)0x0;
  dest = (uchar *)0x0;
  _dlen = (void *)0x0;
  local_48 = 1;
  fin = (FILE *)argv;
  argv_local._0_4_ = argc;
  printf("tgunzip 1.2.1 - example from the tiny inflate library (www.ibsensoftware.com)\n\n");
  if ((int)argv_local == 3) {
    tinf_init();
    fout = (FILE *)fopen(fin->_IO_read_ptr,"rb");
    if ((FILE *)fout == (FILE *)0x0) {
      printf_error("unable to open input file \'%s\'",fin->_IO_read_ptr);
    }
    else {
      source = (uchar *)fopen(fin->_IO_read_end,"wb");
      if ((FILE *)source == (FILE *)0x0) {
        printf_error("unable to create output file \'%s\'",fin->_IO_read_end);
      }
      else {
        fseek((FILE *)fout,0,2);
        lVar2 = ftell((FILE *)fout);
        outlen = (uint)lVar2;
        fseek((FILE *)fout,0,0);
        if (outlen < 0x12) {
          printf_error("input too small to be gzip");
        }
        else {
          dest = (uchar *)malloc((ulong)outlen);
          if (dest == (uchar *)0x0) {
            printf_error("not enough memory");
          }
          else {
            sVar3 = fread(dest,1,(ulong)outlen,(FILE *)fout);
            if (sVar3 == outlen) {
              retval = read_le32(dest + (outlen - 4));
              local_50 = retval;
              if (retval == 0) {
                local_50 = 1;
              }
              _dlen = malloc((ulong)local_50);
              if (_dlen == (void *)0x0) {
                printf_error("not enough memory");
              }
              else {
                res = retval;
                iVar1 = tinf_gzip_uncompress(_dlen,(uint *)&res,dest,outlen);
                if ((iVar1 == 0) && (res == retval)) {
                  printf("decompressed %u bytes\n",(ulong)(uint)res);
                  fwrite(_dlen,1,(ulong)(uint)res,(FILE *)source);
                  local_48 = 0;
                }
                else {
                  printf_error("decompression failed");
                }
              }
            }
            else {
              printf_error("error reading input file");
            }
          }
        }
      }
    }
    if (fout != (FILE *)0x0) {
      fclose((FILE *)fout);
    }
    if (source != (uchar *)0x0) {
      fclose((FILE *)source);
    }
    if (dest != (uchar *)0x0) {
      free(dest);
    }
    if (_dlen != (void *)0x0) {
      free(_dlen);
    }
    argv_local._4_4_ = local_48;
  }
  else {
    fputs("usage: tgunzip INFILE OUTFILE\n\nBoth input and output are kept in memory, so do not use this on huge files.\n"
          ,_stderr);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *fin = NULL;
	FILE *fout = NULL;
	unsigned char *source = NULL;
	unsigned char *dest = NULL;
	unsigned int len, dlen, outlen;
	int retval = EXIT_FAILURE;
	int res;

	printf("tgunzip " TINF_VER_STRING " - example from the tiny inflate library (www.ibsensoftware.com)\n\n");

	if (argc != 3) {
		fputs("usage: tgunzip INFILE OUTFILE\n\n"
		      "Both input and output are kept in memory, so do not use this on huge files.\n", stderr);
		return EXIT_FAILURE;
	}

	tinf_init();

	/* -- Open files -- */

	if ((fin = fopen(argv[1], "rb")) == NULL) {
		printf_error("unable to open input file '%s'", argv[1]);
		goto out;
	}

	if ((fout = fopen(argv[2], "wb")) == NULL) {
		printf_error("unable to create output file '%s'", argv[2]);
		goto out;
	}

	/* -- Read source -- */

	fseek(fin, 0, SEEK_END);

	len = ftell(fin);

	fseek(fin, 0, SEEK_SET);

	if (len < 18) {
		printf_error("input too small to be gzip");
		goto out;
	}

	source = (unsigned char *) malloc(len);

	if (source == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	if (fread(source, 1, len, fin) != len) {
		printf_error("error reading input file");
		goto out;
	}

	/* -- Get decompressed length -- */

	dlen = read_le32(&source[len - 4]);

	dest = (unsigned char *) malloc(dlen ? dlen : 1);

	if (dest == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	/* -- Decompress data -- */

	outlen = dlen;

	res = tinf_gzip_uncompress(dest, &outlen, source, len);

	if ((res != TINF_OK) || (outlen != dlen)) {
		printf_error("decompression failed");
		goto out;
	}

	printf("decompressed %u bytes\n", outlen);

	/* -- Write output -- */

	fwrite(dest, 1, outlen, fout);

	retval = EXIT_SUCCESS;

out:
	if (fin != NULL) {
		fclose(fin);
	}

	if (fout != NULL) {
		fclose(fout);
	}

	if (source != NULL) {
		free(source);
	}

	if (dest != NULL) {
		free(dest);
	}

	return retval;
}